

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

double __thiscall absl::lts_20250127::ToDoubleMinutes(lts_20250127 *this,Duration d)

{
  if (d.rep_hi_.lo_ != 0xffffffff) {
    return ((double)(long)this * 4000000000.0 + (double)d.rep_hi_.lo_) / 240000000000.0;
  }
  return *(double *)(&DAT_01420ef8 + ((long)this >> 0x3f) * -8);
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}